

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void aura_hexdump(char *desc,void *addr,int len)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  uchar buff [17];
  char acStack_48 [24];
  
  if (desc != (char *)0x0) {
    printf("%s:\n",desc);
  }
  if (len < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if ((uVar2 & 0xf) == 0) {
        if (uVar2 != 0) {
          printf("  %s\n",acStack_48);
        }
        printf("  %04x ",uVar2 & 0xffffffff);
      }
      printf(" %02x",(ulong)*(byte *)((long)addr + uVar2));
      cVar1 = *(char *)((long)addr + uVar2);
      if ((byte)(*(char *)((long)addr + uVar2) + 0x81U) < 0xa1) {
        cVar1 = '.';
      }
      acStack_48[(uint)uVar2 & 0xf] = cVar1;
      acStack_48[(uVar2 & 0xf) + 1] = '\0';
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  if ((uVar2 & 0xf) != 0) {
    uVar3 = (uint)uVar2;
    do {
      uVar3 = uVar3 + 1;
      printf("   ");
    } while ((uVar3 & 0xf) != 0);
  }
  printf("  %s\n",acStack_48);
  return;
}

Assistant:

void aura_hexdump(char *desc, void *addr, int len)
{
	int i;
	unsigned char buff[17];
	unsigned char *pc = (unsigned char *)addr;

	if (desc != NULL)
		printf("%s:\n", desc);

	for (i = 0; i < len; i++) {
		if ((i % 16) == 0) {
			if (i != 0)
				printf("  %s\n", buff);
			printf("  %04x ", i);
		}

		printf(" %02x", pc[i]);
		if ((pc[i] < 0x20) || (pc[i] > 0x7e))
			buff[i % 16] = '.';
		else
			buff[i % 16] = pc[i];
		buff[(i % 16) + 1] = '\0';
	}

	while ((i % 16) != 0) {
		printf("   ");
		i++;
	}

	printf("  %s\n", buff);
}